

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O3

void mserialize::detail::visit_arithmetic<mserialize::detail::IntegerToHex,InputStream>
               (char tag,IntegerToHex *visitor,InputStream *istream)

{
  bool bVar1;
  char *pcVar2;
  runtime_error *this;
  uint uVar3;
  ushort uVar4;
  undefined1 *puVar5;
  int iVar6;
  undefined7 in_register_00000039;
  stringstream *psVar7;
  uint8_t B;
  int8_t b;
  char c;
  bool y;
  uint16_t S;
  int16_t s;
  float f;
  uint32_t I;
  int32_t i;
  double d;
  uint64_t L;
  int64_t l;
  byte local_a4;
  char local_a3;
  char local_a2;
  byte local_a1;
  ushort local_a0;
  short local_9e;
  undefined1 local_9c [4];
  uint local_98;
  int local_94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  ulong local_48;
  long local_40;
  undefined1 local_38 [24];
  
  iVar6 = (int)CONCAT71(in_register_00000039,tag);
  if (iVar6 < 0x62) {
    if (iVar6 < 0x49) {
      if (iVar6 != 0x42) {
        if (iVar6 != 0x44) goto switchD_00159211_caseD_65;
        psVar7 = istream->stream;
        puVar5 = local_38;
        goto LAB_0015937a;
      }
      std::istream::read((char *)istream->stream,(long)&local_a4);
      if (local_a4 != 0) {
        pcVar2 = visitor->_buffer + 0x13;
        do {
          pcVar2[-1] = "0123456789ABCDEF"[local_a4 & 0xf];
          pcVar2 = pcVar2 + -1;
          bVar1 = 0xf < local_a4;
          local_a4 = local_a4 >> 4;
        } while (bVar1);
        goto LAB_001594b1;
      }
    }
    else if (iVar6 == 0x49) {
      std::istream::read((char *)istream->stream,(long)&local_98);
      if (local_98 != 0) {
        pcVar2 = visitor->_buffer + 0x13;
        do {
          pcVar2[-1] = "0123456789ABCDEF"[local_98 & 0xf];
          pcVar2 = pcVar2 + -1;
          bVar1 = 0xf < local_98;
          local_98 = local_98 >> 4;
        } while (bVar1);
        goto LAB_001594b1;
      }
    }
    else if (iVar6 == 0x4c) {
      std::istream::read((char *)istream->stream,(long)&local_48);
      if (local_48 != 0) {
        pcVar2 = visitor->_buffer + 0x13;
        do {
          pcVar2[-1] = "0123456789ABCDEF"[(uint)local_48 & 0xf];
          pcVar2 = pcVar2 + -1;
          bVar1 = 0xf < local_48;
          local_48 = local_48 >> 4;
        } while (bVar1);
        goto LAB_001594b1;
      }
    }
    else {
      if (iVar6 != 0x53) goto switchD_00159211_caseD_65;
      std::istream::read((char *)istream->stream,(long)&local_a0);
      if (local_a0 != 0) {
        pcVar2 = visitor->_buffer + 0x13;
        uVar3 = (uint)local_a0;
        do {
          pcVar2[-1] = "0123456789ABCDEF"[uVar3 & 0xf];
          pcVar2 = pcVar2 + -1;
          uVar4 = (ushort)uVar3;
          uVar3 = uVar3 >> 4;
        } while (0xf < uVar4);
        goto LAB_001594b1;
      }
    }
    pcVar2 = visitor->_buffer + 0x12;
    visitor->_buffer[0x12] = '0';
    goto LAB_001594b1;
  }
  switch(iVar6) {
  case 0x62:
    std::istream::read((char *)istream->stream,(long)&local_a3);
    pcVar2 = write_integer_as_hex<signed_char>(local_a3,visitor->_buffer + 0x13);
    break;
  case 99:
    std::istream::read((char *)istream->stream,(long)&local_a2);
    pcVar2 = write_integer_as_hex<char>(local_a2,visitor->_buffer + 0x13);
    break;
  case 100:
    psVar7 = istream->stream;
    puVar5 = local_50;
    goto LAB_0015937a;
  case 0x65:
  case 0x67:
  case 0x68:
  case 0x6a:
  case 0x6b:
switchD_00159211_caseD_65:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"Invalid arithmetic tag: ","");
    std::operator+(&local_70,&local_90,tag);
    std::runtime_error::runtime_error(this,(string *)&local_70);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 0x66:
    psVar7 = istream->stream;
    puVar5 = local_9c;
LAB_0015937a:
    std::istream::read((char *)psVar7,(long)puVar5);
    return;
  case 0x69:
    std::istream::read((char *)istream->stream,(long)&local_94);
    pcVar2 = write_integer_as_hex<int>(local_94,visitor->_buffer + 0x13);
    break;
  case 0x6c:
    std::istream::read((char *)istream->stream,(long)&local_40);
    pcVar2 = write_integer_as_hex<long>(local_40,visitor->_buffer + 0x13);
    break;
  default:
    if (iVar6 != 0x73) {
      if (iVar6 == 0x79) {
        std::istream::read((char *)istream->stream,(long)&local_a1);
        visitor->_buffer[0x12] = local_a1 | 0x30;
        visitor->_p = visitor->_buffer + 0x12;
        return;
      }
      goto switchD_00159211_caseD_65;
    }
    std::istream::read((char *)istream->stream,(long)&local_9e);
    pcVar2 = write_integer_as_hex<short>(local_9e,visitor->_buffer + 0x13);
  }
LAB_001594b1:
  visitor->_p = pcVar2;
  return;
}

Assistant:

void visit_arithmetic(char tag, Visitor& visitor, InputStream& istream)
{
  switch(tag)
  {
  case 'y': bool y; mserialize::deserialize(y, istream); visitor.visit(y); break;
  case 'c': char c; mserialize::deserialize(c, istream); visitor.visit(c); break;

  case 'b': std::int8_t  b; mserialize::deserialize(b, istream); visitor.visit(b); break;
  case 's': std::int16_t s; mserialize::deserialize(s, istream); visitor.visit(s); break;
  case 'i': std::int32_t i; mserialize::deserialize(i, istream); visitor.visit(i); break;
  case 'l': std::int64_t l; mserialize::deserialize(l, istream); visitor.visit(l); break;

  case 'B': std::uint8_t  B; mserialize::deserialize(B, istream); visitor.visit(B); break;
  case 'S': std::uint16_t S; mserialize::deserialize(S, istream); visitor.visit(S); break;
  case 'I': std::uint32_t I; mserialize::deserialize(I, istream); visitor.visit(I); break;
  case 'L': std::uint64_t L; mserialize::deserialize(L, istream); visitor.visit(L); break;

  case 'f': float f;       mserialize::deserialize(f, istream); visitor.visit(f); break;
  case 'd': double d;      mserialize::deserialize(d, istream); visitor.visit(d); break;
  case 'D': long double D; mserialize::deserialize(D, istream); visitor.visit(D); break;
  default: throw std::runtime_error(std::string("Invalid arithmetic tag: ") + tag); break;
  }
}